

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O2

tuple<double,_arma::Col<double>_> * __thiscall
Kriging::leaveOneOutFun
          (tuple<double,_arma::Col<double>_> *__return_storage_ptr__,Kriging *this,vec *_theta,
          bool _grad,bool _bench)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  undefined7 in_register_00000081;
  _Base_ptr num;
  double local_1f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  bench;
  string local_1b8;
  Mat<double> local_198;
  Mat<double> local_e8;
  
  local_e8.n_rows = 0;
  local_e8.n_cols = 1;
  local_e8.n_elem = 0;
  local_e8.n_alloc = 0;
  local_e8.vec_state = 1;
  local_e8.mem_state = 0;
  local_e8.mem = (double *)0x0;
  if ((int)CONCAT71(in_register_00000081,_bench) == 0) {
    if (_grad) {
      arma::Col<double>::Col((Col<double> *)&local_198,(_theta->super_Mat<double>).n_elem);
      arma::Col<double>::operator=((Col<double> *)&local_e8,(Col<double> *)&local_198);
      arma::Mat<double>::~Mat(&local_198);
      local_1f8 = _leaveOneOut(this,_theta,(vec *)&local_e8,(mat *)0x0,(KModel *)0x0,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                *)0x0);
    }
    else {
      local_1f8 = _leaveOneOut(this,_theta,(vec *)0x0,(mat *)0x0,(KModel *)0x0,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                *)0x0);
    }
  }
  else {
    p_Var1 = &bench._M_t._M_impl.super__Rb_tree_header;
    bench._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    bench._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    bench._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    bench._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    bench._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (_grad) {
      arma::Col<double>::Col((Col<double> *)&local_198,(_theta->super_Mat<double>).n_elem);
      arma::Col<double>::operator=((Col<double> *)&local_e8,(Col<double> *)&local_198);
      arma::Mat<double>::~Mat(&local_198);
      local_1f8 = _leaveOneOut(this,_theta,(vec *)&local_e8,(mat *)0x0,(KModel *)0x0,&bench);
    }
    else {
      local_1f8 = _leaveOneOut(this,_theta,(vec *)0x0,(mat *)0x0,(KModel *)0x0,&bench);
    }
    p_Var4 = bench._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    num = (_Base_ptr)0x0;
    for (p_Var2 = bench._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (num < p_Var2[1]._M_parent) {
        num = p_Var2[1]._M_parent;
      }
    }
    for (; (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4))
    {
      poVar3 = std::operator<<((ostream *)&std::cout,"| ");
      std::__cxx11::string::string((string *)&local_1b8,(string *)(p_Var4 + 1));
      Bench::pad((string *)&local_198,&local_1b8,(size_t)num,' ');
      poVar3 = std::operator<<(poVar3,(string *)&local_198);
      std::operator<<(poVar3," | ");
      poVar3 = std::ostream::_M_insert<double>(*(double *)(p_Var4 + 2));
      poVar3 = std::operator<<(poVar3," |");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~_Rb_tree(&bench._M_t);
  }
  arma::Col<double>::Col((Col<double> *)__return_storage_ptr__,(Col<double> *)&local_e8);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_double,_arma::Col<double>_>).
  super__Head_base<0UL,_double,_false>._M_head_impl = local_1f8;
  arma::Mat<double>::~Mat(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

LIBKRIGING_EXPORT std::tuple<double, arma::vec> Kriging::leaveOneOutFun(const arma::vec& _theta,
                                                                        const bool _grad,
                                                                        const bool _bench) {
  double loo = -1;
  arma::vec grad;

  if (_bench) {
    std::map<std::string, double> bench;
    if (_grad) {
      grad = arma::vec(_theta.n_elem);
      loo = _leaveOneOut(_theta, &grad, nullptr, nullptr, &bench);
    } else
      loo = _leaveOneOut(_theta, nullptr, nullptr, nullptr, &bench);

    size_t num = 0;
    for (auto& kv : bench)
      num = std::max(kv.first.size(), num);
    for (auto& kv : bench)
      arma::cout << "| " << Bench::pad(kv.first, num, ' ') << " | " << kv.second << " |" << arma::endl;

  } else {
    if (_grad) {
      grad = arma::vec(_theta.n_elem);
      loo = _leaveOneOut(_theta, &grad, nullptr, nullptr, nullptr);
    } else
      loo = _leaveOneOut(_theta, nullptr, nullptr, nullptr, nullptr);
  }

  return std::make_tuple(loo, std::move(grad));
}